

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

String * __thiscall Path::readAll(String *__return_storage_ptr__,Path *this,size_t max)

{
  char *__filename;
  FILE *__stream;
  FILE *f;
  size_t max_local;
  Path *this_local;
  String *ret;
  
  __filename = String::constData(&this->super_String);
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  }
  else {
    f._0_4_ = (int)max;
    Rct::readAll(__return_storage_ptr__,(FILE *)__stream,(int)f);
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

String Path::readAll(size_t max) const
{
    FILE *f = fopen(constData(), "r");
    if (!f)
        return String();
    const String ret = Rct::readAll(f, max);
    fclose(f);
    return ret;
}